

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O3

void __thiscall Strings::QuotedEncoding::quoteChar(QuotedEncoding *this,char c)

{
  char c_00;
  uint uVar1;
  
  uVar1 = this->lastOne;
  if (uVar1 != 0xffffffff) {
    if (c == '\n' && uVar1 == 0xd) {
      Bstrlib::String::operator+=(this->out,'\r');
      this->lineLength = 0;
      uVar1 = this->lastOne;
LAB_00113bd9:
      writeHex(this,(char)uVar1);
    }
    else {
      if ((c == '\r') || (c == '\n')) goto LAB_00113bd9;
      c_00 = (char)uVar1;
      if ((c_00 == '\r') || ((uVar1 & 0xff) == 10)) {
        Bstrlib::String::operator+=(this->out,c_00);
        this->lineLength = 0;
      }
      else if (this->lineLength < 0x4b) {
        Bstrlib::String::operator+=(this->out,c_00);
        this->lineLength = this->lineLength + 1;
      }
      else {
        Bstrlib::String::operator+=(this->out,"=\r\n");
        Bstrlib::String::operator+=(this->out,c_00);
        this->lineLength = 1;
      }
    }
    this->lastOne = -1;
  }
  if (c < '\r') {
    if (c == '\t') {
LAB_00113c07:
      this->lastOne = (uint)(byte)c;
      return;
    }
    if (c != '\n') {
LAB_00113c2c:
      if (c == '=' || 0x5d < (byte)(c - 0x21U)) {
        writeHex(this,c);
        return;
      }
      if (this->lineLength < 0x4b) {
        Bstrlib::String::operator+=(this->out,c);
        this->lineLength = this->lineLength + 1;
        return;
      }
      Bstrlib::String::operator+=(this->out,"=\r\n");
      Bstrlib::String::operator+=(this->out,c);
      this->lineLength = 1;
      return;
    }
  }
  else if (c != '\r') {
    if (c != ' ') goto LAB_00113c2c;
    goto LAB_00113c07;
  }
  Bstrlib::String::operator+=(this->out,c);
  this->lineLength = 0;
  return;
}

Assistant:

inline void quoteChar(const char c)
        {
            if (lastOne != -1)
            {
                // CRLF is allowed on end of line
                if (lastOne == '\r' && c == '\n')
			        writeASCII((char)lastOne);
	            if (c == '\r' || c == '\n')
		            writeHex((char)lastOne);
	            else writeASCII((char)lastOne);

	            lastOne = -1;
            }
            if (c == '\t' || c == ' ') lastOne = (int)c;
            else if (c == '\r' || c == '\n' || (c > 32 && c < 127 && c != '=')) writeASCII(c);
            else writeHex(c);
        }